

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O2

void __thiscall
CaDiCaL::Internal::try_to_eliminate_variable
          (Internal *this,Eliminator *eliminator,int pivot,bool *deleted_binary_clause)

{
  pointer pvVar1;
  uint uVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  
  uVar7 = -pivot;
  uVar2 = pivot;
  if (pivot < 1) {
    uVar2 = uVar7;
  }
  if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar2] & 0x7000000) == 0x1000000) {
    sVar4 = flush_occs(this,pivot);
    sVar5 = flush_occs(this,uVar7);
    sVar6 = sVar5;
    if ((long)sVar4 < (long)sVar5) {
      sVar6 = sVar4;
    }
    if ((long)sVar5 < (long)sVar4) {
      pivot = uVar7;
      sVar5 = sVar4;
    }
    if ((sVar6 == 0) || ((long)sVar5 <= (long)(this->opts).elimocclim)) {
      uVar7 = uVar2 << 1 | (uint)pivot >> 0x1f;
      pvVar1 = (this->otab).
               super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      __stable_sort<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                (pvVar1[uVar7].
                 super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&pvVar1[uVar7].
                          super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                          _M_impl.super__Vector_impl_data + 8));
      uVar7 = (uint)-pivot >> 0x1f | uVar2 << 1;
      pvVar1 = (this->otab).
               super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      __stable_sort<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CaDiCaL::clause_smaller_size>>
                (pvVar1[uVar7].
                 super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&pvVar1[uVar7].
                          super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                          _M_impl.super__Vector_impl_data + 8));
      if (sVar6 != 0) {
        find_gate_clauses(this,eliminator,pivot);
      }
      if (((this->unsat == false) && (this->vals[pivot] == '\0')) &&
         (bVar3 = elim_resolvents_are_bounded(this,eliminator,pivot), bVar3)) {
        elim_add_resolvents(this,eliminator,pivot);
        if (this->unsat == false) {
          mark_eliminated_clauses_as_garbage(this,eliminator,pivot,deleted_binary_clause);
        }
        if (((uint)(this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar2] & 0x7000000) == 0x1000000) {
          mark_eliminated(this,pivot);
        }
      }
      unmark_gate_clauses(this,eliminator);
      elim_backward_clauses(this,eliminator);
      return;
    }
  }
  return;
}

Assistant:

void Internal::try_to_eliminate_variable (Eliminator &eliminator, int pivot,
                                          bool &deleted_binary_clause) {

  if (!active (pivot))
    return;
  assert (!frozen (pivot));

  // First flush garbage clauses.
  //
  int64_t pos = flush_occs (pivot);
  int64_t neg = flush_occs (-pivot);

  if (pos > neg) {
    pivot = -pivot;
    swap (pos, neg);
  }
  LOG ("pivot %d occurs positively %" PRId64
       " times and negatively %" PRId64 " times",
       pivot, pos, neg);
  assert (!eliminator.schedule.contains (abs (pivot)));
  assert (pos <= neg);

  if (pos && neg > opts.elimocclim) {
    LOG ("too many occurrences thus not eliminated %d", pivot);
    assert (!eliminator.schedule.contains (abs (pivot)));
    return;
  }

  LOG ("trying to eliminate %d", pivot);
  assert (!flags (pivot).eliminated ());

  // Sort occurrence lists, such that shorter clauses come first.
  Occs &ps = occs (pivot);
  stable_sort (ps.begin (), ps.end (), clause_smaller_size ());
  Occs &ns = occs (-pivot);
  stable_sort (ns.begin (), ns.end (), clause_smaller_size ());

  if (pos)
    find_gate_clauses (eliminator, pivot);

  if (!unsat && !val (pivot)) {
    if (elim_resolvents_are_bounded (eliminator, pivot)) {
      LOG ("number of resolvents on %d are bounded", pivot);
      elim_add_resolvents (eliminator, pivot);
      if (!unsat)
        mark_eliminated_clauses_as_garbage (eliminator, pivot,
                                            deleted_binary_clause);
      if (active (pivot))
        mark_eliminated (pivot);
    } else
      LOG ("too many resolvents on %d so not eliminated", pivot);
  }

  unmark_gate_clauses (eliminator);
  elim_backward_clauses (eliminator);
}